

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CovergroupType::serializeTo(CovergroupType *this,ASTSerializer *serializer)

{
  TimingControl *__n;
  Type *pTVar1;
  CovergroupType *in_RSI;
  char *in_RDI;
  Type *bg;
  TimingControl *ev;
  CovergroupType *in_stack_00000068;
  Symbol *in_stack_000000a8;
  ASTSerializer *in_stack_000000b0;
  undefined1 in_stack_000000b8 [16];
  CovergroupType *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined4 local_28;
  undefined8 local_20;
  
  __n = getCoverageEvent(in_stack_00000068);
  if (__n != (TimingControl *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,in_RDI);
    ASTSerializer::write((ASTSerializer *)in_RSI,local_28,local_20,(size_t)__n);
    in_stack_ffffffffffffffb0 = in_RSI;
  }
  pTVar1 = getBaseGroup(in_stack_ffffffffffffffb0);
  if (pTVar1 != (Type *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffc0,in_RDI);
    ASTSerializer::writeLink(in_stack_000000b0,(string_view)in_stack_000000b8,in_stack_000000a8);
  }
  return;
}

Assistant:

void CovergroupType::serializeTo(ASTSerializer& serializer) const {
    if (auto ev = getCoverageEvent())
        serializer.write("event", *ev);
    if (auto bg = getBaseGroup())
        serializer.writeLink("baseGroup", *bg);
}